

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

ImVec4_Simple igColorConvertU32ToFloat4_nonUDT2(ImU32 in)

{
  ImVec4 vec;
  ImVec4_Simple IVar1;
  ImVec4 ret;
  ImU32 in_local;
  ImVec4_Simple ret2;
  
  vec = ImGui::ColorConvertU32ToFloat4(in);
  IVar1 = ImVec4ToSimple(vec);
  return IVar1;
}

Assistant:

CIMGUI_API ImVec4_Simple *_igColorConvertU32ToFloat4_nonUDT2 (ImU32 *larg1) {
  ImVec4_Simple * lresult = (ImVec4_Simple *)0 ;
  ImU32 arg1 ;
  ImVec4_Simple result;
  
  arg1 = *larg1;
  try {
    result = igColorConvertU32ToFloat4_nonUDT2(arg1);
    lresult = new ImVec4_Simple(result);
    return lresult;
  } catch (...) {
    return (ImVec4_Simple *)0;
  }
}